

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

Descriptor *
google::protobuf::anon_unknown_14::DefaultFinderFindAnyType
          (Message *message,string *prefix,string *name)

{
  int iVar1;
  Descriptor *pDVar2;
  string_view name_00;
  Metadata MVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)prefix);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)prefix);
    if (iVar1 != 0) {
      return (Descriptor *)0x0;
    }
  }
  MVar3 = Message::GetMetadata(message);
  name_00._M_str = (name->_M_dataplus)._M_p;
  name_00._M_len = name->_M_string_length;
  pDVar2 = DescriptorPool::FindMessageTypeByName((MVar3.descriptor)->file_->pool_,name_00);
  return pDVar2;
}

Assistant:

const Descriptor* DefaultFinderFindAnyType(const Message& message,
                                           const std::string& prefix,
                                           const std::string& name) {
  if (prefix != internal::kTypeGoogleApisComPrefix &&
      prefix != internal::kTypeGoogleProdComPrefix) {
    return nullptr;
  }
  return message.GetDescriptor()->file()->pool()->FindMessageTypeByName(name);
}